

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStems<short>
               (char *label_id,short *xs,short *ys,int count,double y_ref,int offset,int stride)

{
  undefined1 local_78 [8];
  GetterXsYRef<short> get_base;
  GetterXsYs<short> get_mark;
  int stride_local;
  int offset_local;
  double y_ref_local;
  int count_local;
  short *ys_local;
  short *xs_local;
  char *label_id_local;
  
  GetterXsYs<short>::GetterXsYs((GetterXsYs<short> *)&get_base.Stride,xs,ys,count,offset,stride);
  GetterXsYRef<short>::GetterXsYRef((GetterXsYRef<short> *)local_78,xs,y_ref,count,offset,stride);
  PlotStemsEx<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>>
            (label_id,(GetterXsYs<short> *)&get_base.Stride,(GetterXsYRef<short> *)local_78);
  return;
}

Assistant:

void PlotStems(const char* label_id, const T* xs, const T* ys, int count, double y_ref, int offset, int stride) {
    GetterXsYs<T> get_mark(xs,ys,count,offset,stride);
    GetterXsYRef<T> get_base(xs,y_ref,count,offset,stride);
    PlotStemsEx(label_id, get_mark, get_base);
}